

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertySkipSpaces(Scl_Tree_t *p,char **ppPos,char *pEnd,int fStopAtNewLine)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  pbVar2 = (byte *)*ppPos;
  pbVar3 = pbVar2;
  if (pbVar2 < pEnd) {
    while ((pbVar3 = pbVar2, *pbVar2 != 10 || (p->nLines = p->nLines + 1, fStopAtNewLine == 0))) {
      bVar1 = *pbVar2;
      if ((((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
          (bVar1 != 0x5c)) || (pbVar2 = pbVar2 + 1, pbVar3 = (byte *)pEnd, pbVar2 == (byte *)pEnd))
      break;
    }
  }
  *ppPos = (char *)pbVar3;
  return (int)(pbVar3 == (byte *)pEnd);
}

Assistant:

static inline int Scl_LibertySkipSpaces( Scl_Tree_t * p, char ** ppPos, char * pEnd, int fStopAtNewLine )
{
    char * pPos = *ppPos;
    for ( ; pPos < pEnd; pPos++ )
    {
        if ( *pPos == '\n' )
        {
            p->nLines++;
            if ( fStopAtNewLine )
                break;
        }        
        if ( !Scl_LibertyCharIsSpace(*pPos) )
            break;
    }
    *ppPos = pPos;
    return pPos == pEnd;
}